

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility_tests.cpp
# Opt level: O0

void __thiscall
test::iu_Compatibility_x_iutest_x_TestInfo_Test::~iu_Compatibility_x_iutest_x_TestInfo_Test
          (iu_Compatibility_x_iutest_x_TestInfo_Test *this)

{
  iu_Compatibility_x_iutest_x_TestInfo_Test *this_local;
  
  ~iu_Compatibility_x_iutest_x_TestInfo_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(Compatibility, TestInfo)
{
    const ::iutest::TestInfo* testinfo = ::iutest::UnitTest::GetInstance()->current_test_info();
    IUTEST_ASSERT_NOTNULL(testinfo);

#if !defined(IUTEST_REMOVE_LEGACY_TEST_CASEAPI_)
    (void)testinfo->test_case_name();
#endif
#if IUTEST_HAS_TESTSUITE
    (void)testinfo->test_suite_name();
#endif
    (void)testinfo->name();
#if !defined(IUTEST_USE_GTEST) || (defined(GTEST_MINOR) && GTEST_MINOR >= 0x06)
    (void)testinfo->type_param();
    (void)testinfo->value_param();
#endif
#if !defined(IUTEST_USE_GTEST) || (defined(GTEST_MINOR) && GTEST_MINOR >= 0x07)
    (void)testinfo->is_reportable();
#endif
    (void)testinfo->should_run();
    (void)testinfo->result();
}